

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unescape.cc
# Opt level: O2

uint32_t re2c::unesc_hex(char *s,char *s_end)

{
  uint32_t uVar1;
  char *pcVar2;
  int iVar3;
  
  uVar1 = 0;
  for (pcVar2 = s + 2; pcVar2 != s_end; pcVar2 = pcVar2 + 1) {
    iVar3 = -1;
    if ((byte)(*pcVar2 - 0x30U) < 0x37) {
      iVar3 = *(int *)(&DAT_001536c4 + (ulong)(byte)(*pcVar2 - 0x30U) * 4);
    }
    uVar1 = uVar1 * 0x10 + iVar3;
  }
  return uVar1;
}

Assistant:

uint32_t unesc_hex (const char * s, const char * s_end)
{
	uint32_t n = 0;
	for (s += 2; s != s_end; ++s)
	{
		n <<= 4;
		n += hex_digit (*s);
	}
	return n;
}